

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::resize
          (file_pool_impl<libtorrent::aux::file_view_entry> *this,int size)

{
  size_type sVar1;
  undefined1 local_60 [40];
  unique_lock<std::mutex> l;
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  defer_destruction;
  int size_local;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_local;
  
  ::std::
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ::vector((vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
            *)&l._M_owns);
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)(local_60 + 0x20),&this->m_mutex);
  if (size == this->m_size) {
    local_60._16_4_ = 1;
  }
  else {
    this->m_size = size;
    sVar1 = boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::size(&(this->m_files).super_type.super_type);
    if (this->m_size < (int)sVar1) {
      while (sVar1 = boost::multi_index::detail::
                     ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                     ::size(&(this->m_files).super_type.super_type), this->m_size < (int)sVar1) {
        remove_oldest((file_pool_impl<libtorrent::aux::file_view_entry> *)local_60,
                      (unique_lock<std::mutex> *)this);
        ::std::
        vector<std::shared_ptr<libtorrent::aux::file_mapping>,std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>>>
        ::emplace_back<std::shared_ptr<libtorrent::aux::file_mapping>>
                  ((vector<std::shared_ptr<libtorrent::aux::file_mapping>,std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>>>
                    *)&l._M_owns,(shared_ptr<libtorrent::aux::file_mapping> *)local_60);
        ::std::shared_ptr<libtorrent::aux::file_mapping>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::file_mapping> *)local_60);
      }
      local_60._16_4_ = 0;
    }
    else {
      local_60._16_4_ = 1;
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_60 + 0x20));
  ::std::
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ::~vector((vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
             *)&l._M_owns);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::resize(int const size)
	{
		// these are destructed _after_ the mutex is released
		std::vector<FileHandle> defer_destruction;

		std::unique_lock<std::mutex> l(m_mutex);

		TORRENT_ASSERT(size > 0);

		if (size == m_size) return;
		m_size = size;
		if (int(m_files.size()) <= m_size) return;

		// close the least recently used files
		while (int(m_files.size()) > m_size)
			defer_destruction.emplace_back(remove_oldest(l));
	}